

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::D3MFImporter::CanRead
          (D3MFImporter *this,string *filename,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  D3MFOpcPackage opcPackage;
  string extension;
  D3MFOpcPackage local_50;
  string local_40;
  
  BaseImporter::GetExtension(&local_40,filename);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else {
    bVar1 = false;
    if ((pIOHandler != (IOSystem *)0x0) &&
       (bVar1 = false, local_40._M_string_length == 0 || checkSig)) {
      bVar1 = ZipArchiveIOSystem::isZipArchive(pIOHandler,filename);
      if (bVar1) {
        D3MF::D3MFOpcPackage::D3MFOpcPackage(&local_50,pIOHandler,filename);
        bVar1 = D3MF::D3MFOpcPackage::validate(&local_50);
        D3MF::D3MFOpcPackage::~D3MFOpcPackage(&local_50);
      }
      else {
        bVar1 = false;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool D3MFImporter::CanRead(const std::string &filename, IOSystem *pIOHandler, bool checkSig) const {
    const std::string extension( GetExtension( filename ) );
    if(extension == desc.mFileExtensions ) {
        return true;
    } else if ( !extension.length() || checkSig ) {
        if ( nullptr == pIOHandler ) {
            return false;
        }
        if ( !ZipArchiveIOSystem::isZipArchive( pIOHandler, filename ) ) {
            return false;
        }
        D3MF::D3MFOpcPackage opcPackage( pIOHandler, filename );
        return opcPackage.validate();
    }

    return false;
}